

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceArrayIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool bVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  NodeRef *pNVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  Primitive *prim;
  int iVar23;
  undefined4 uVar24;
  ulong unaff_R14;
  size_t mask;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  Precalculations pre;
  NodeRef stack [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar5 = ray->tfar, 0.0 <= fVar5)) {
    pNVar18 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar9 = (ray->org).field_0.m128[0];
    fVar10 = (ray->org).field_0.m128[1];
    fVar11 = (ray->org).field_0.m128[2];
    aVar6 = (ray->dir).field_0.field_1;
    fVar37 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar36 = 0.0;
    if (0.0 <= fVar37) {
      fVar36 = fVar37;
    }
    auVar26._4_4_ = -(uint)(ABS(aVar6.y) < DAT_01ff1d40._4_4_);
    auVar26._0_4_ = -(uint)(ABS(aVar6.x) < (float)DAT_01ff1d40);
    auVar26._8_4_ = -(uint)(ABS(aVar6.z) < DAT_01ff1d40._8_4_);
    auVar26._12_4_ = -(uint)(ABS(aVar6.field_3.w) < DAT_01ff1d40._12_4_);
    auVar28 = blendvps((undefined1  [16])aVar6,_DAT_01ff1d40,auVar26);
    auVar26 = rcpps(auVar26,auVar28);
    fVar37 = auVar26._0_4_;
    fVar38 = auVar26._4_4_;
    fVar39 = auVar26._8_4_;
    fVar37 = (1.0 - auVar28._0_4_ * fVar37) * fVar37 + fVar37;
    fVar38 = (1.0 - auVar28._4_4_ * fVar38) * fVar38 + fVar38;
    fVar39 = (1.0 - auVar28._8_4_ * fVar39) * fVar39 + fVar39;
    uVar19 = (ulong)(fVar37 < 0.0) * 0x10;
    uVar20 = (ulong)(fVar38 < 0.0) << 4 | 0x20;
    uVar21 = (ulong)(fVar39 < 0.0) << 4 | 0x40;
    do {
      if (pNVar18 == stack) {
        return;
      }
      sVar22 = pNVar18[-1].ptr;
      pNVar18 = pNVar18 + -1;
      do {
        if ((sVar22 & 8) == 0) {
          fVar12 = (ray->dir).field_0.m128[3];
          uVar14 = sVar22 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar14 + 0x80 + uVar19);
          pfVar1 = (float *)(uVar14 + 0x20 + uVar19);
          auVar29._0_4_ = ((*pfVar2 * fVar12 + *pfVar1) - fVar9) * fVar37;
          auVar29._4_4_ = ((pfVar2[1] * fVar12 + pfVar1[1]) - fVar9) * fVar37;
          auVar29._8_4_ = ((pfVar2[2] * fVar12 + pfVar1[2]) - fVar9) * fVar37;
          auVar29._12_4_ = ((pfVar2[3] * fVar12 + pfVar1[3]) - fVar9) * fVar37;
          auVar32._4_4_ = fVar36;
          auVar32._0_4_ = fVar36;
          auVar32._8_4_ = fVar36;
          auVar32._12_4_ = fVar36;
          pfVar2 = (float *)(uVar14 + 0x80 + uVar20);
          pfVar1 = (float *)(uVar14 + 0x20 + uVar20);
          auVar26 = maxps(auVar32,auVar29);
          auVar33._0_4_ = ((*pfVar2 * fVar12 + *pfVar1) - fVar10) * fVar38;
          auVar33._4_4_ = ((pfVar2[1] * fVar12 + pfVar1[1]) - fVar10) * fVar38;
          auVar33._8_4_ = ((pfVar2[2] * fVar12 + pfVar1[2]) - fVar10) * fVar38;
          auVar33._12_4_ = ((pfVar2[3] * fVar12 + pfVar1[3]) - fVar10) * fVar38;
          pfVar2 = (float *)(uVar14 + 0x80 + uVar21);
          pfVar1 = (float *)(uVar14 + 0x20 + uVar21);
          auVar30._0_4_ = ((*pfVar2 * fVar12 + *pfVar1) - fVar11) * fVar39;
          auVar30._4_4_ = ((pfVar2[1] * fVar12 + pfVar1[1]) - fVar11) * fVar39;
          auVar30._8_4_ = ((pfVar2[2] * fVar12 + pfVar1[2]) - fVar11) * fVar39;
          auVar30._12_4_ = ((pfVar2[3] * fVar12 + pfVar1[3]) - fVar11) * fVar39;
          auVar28 = maxps(auVar33,auVar30);
          auVar26 = maxps(auVar26,auVar28);
          pfVar2 = (float *)(uVar14 + 0x80 + (uVar19 ^ 0x10));
          pfVar1 = (float *)(uVar14 + 0x20 + (uVar19 ^ 0x10));
          auVar34._0_4_ = ((*pfVar2 * fVar12 + *pfVar1) - fVar9) * fVar37;
          auVar34._4_4_ = ((pfVar2[1] * fVar12 + pfVar1[1]) - fVar9) * fVar37;
          auVar34._8_4_ = ((pfVar2[2] * fVar12 + pfVar1[2]) - fVar9) * fVar37;
          auVar34._12_4_ = ((pfVar2[3] * fVar12 + pfVar1[3]) - fVar9) * fVar37;
          auVar31._4_4_ = fVar5;
          auVar31._0_4_ = fVar5;
          auVar31._8_4_ = fVar5;
          auVar31._12_4_ = fVar5;
          auVar32 = minps(auVar31,auVar34);
          pfVar3 = (float *)(uVar14 + 0x80 + (uVar20 ^ 0x10));
          pfVar1 = (float *)(uVar14 + 0x20 + (uVar20 ^ 0x10));
          pfVar4 = (float *)(uVar14 + 0x80 + (uVar21 ^ 0x10));
          pfVar2 = (float *)(uVar14 + 0x20 + (uVar21 ^ 0x10));
          auVar35._0_4_ = ((*pfVar3 * fVar12 + *pfVar1) - fVar10) * fVar38;
          auVar35._4_4_ = ((pfVar3[1] * fVar12 + pfVar1[1]) - fVar10) * fVar38;
          auVar35._8_4_ = ((pfVar3[2] * fVar12 + pfVar1[2]) - fVar10) * fVar38;
          auVar35._12_4_ = ((pfVar3[3] * fVar12 + pfVar1[3]) - fVar10) * fVar38;
          auVar28._4_4_ = ((pfVar4[1] * fVar12 + pfVar2[1]) - fVar11) * fVar39;
          auVar28._0_4_ = ((*pfVar4 * fVar12 + *pfVar2) - fVar11) * fVar39;
          auVar28._8_4_ = ((pfVar4[2] * fVar12 + pfVar2[2]) - fVar11) * fVar39;
          auVar28._12_4_ = ((pfVar4[3] * fVar12 + pfVar2[3]) - fVar11) * fVar39;
          auVar28 = minps(auVar35,auVar28);
          auVar28 = minps(auVar32,auVar28);
          bVar25 = auVar26._0_4_ <= auVar28._0_4_;
          bVar13 = auVar26._4_4_ <= auVar28._4_4_;
          bVar7 = auVar26._8_4_ <= auVar28._8_4_;
          bVar8 = auVar26._12_4_ <= auVar28._12_4_;
          if (((uint)sVar22 & 7) == 6) {
            bVar25 = (fVar12 < *(float *)(uVar14 + 0xf0) && *(float *)(uVar14 + 0xe0) <= fVar12) &&
                     bVar25;
            bVar13 = (fVar12 < *(float *)(uVar14 + 0xf4) && *(float *)(uVar14 + 0xe4) <= fVar12) &&
                     bVar13;
            bVar7 = (fVar12 < *(float *)(uVar14 + 0xf8) && *(float *)(uVar14 + 0xe8) <= fVar12) &&
                    bVar7;
            bVar8 = (fVar12 < *(float *)(uVar14 + 0xfc) && *(float *)(uVar14 + 0xec) <= fVar12) &&
                    bVar8;
          }
          auVar27._0_4_ = (uint)bVar25 * -0x80000000;
          auVar27._4_4_ = (uint)bVar13 * -0x80000000;
          auVar27._8_4_ = (uint)bVar7 * -0x80000000;
          auVar27._12_4_ = (uint)bVar8 * -0x80000000;
          uVar24 = movmskps((int)unaff_R14,auVar27);
          unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar24);
        }
        if ((sVar22 & 8) == 0) {
          if (unaff_R14 == 0) {
            iVar23 = 4;
          }
          else {
            uVar14 = sVar22 & 0xfffffffffffffff0;
            lVar16 = 0;
            if (unaff_R14 != 0) {
              for (; (unaff_R14 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
              }
            }
            iVar23 = 0;
            sVar22 = *(size_t *)(uVar14 + lVar16 * 8);
            uVar17 = unaff_R14 - 1 & unaff_R14;
            if (uVar17 != 0) {
              pNVar18->ptr = sVar22;
              lVar16 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                }
              }
              uVar15 = uVar17 - 1;
              while( true ) {
                pNVar18 = pNVar18 + 1;
                sVar22 = *(size_t *)(uVar14 + lVar16 * 8);
                uVar15 = uVar15 & uVar17;
                if (uVar15 == 0) break;
                pNVar18->ptr = sVar22;
                lVar16 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                  }
                }
                uVar17 = uVar15 - 1;
              }
            }
          }
        }
        else {
          iVar23 = 6;
        }
      } while (iVar23 == 0);
      if (iVar23 == 6) {
        uVar14 = (ulong)((uint)sVar22 & 0xf);
        iVar23 = 0;
        bVar25 = uVar14 != 8;
        if (bVar25) {
          prim = (Primitive *)(sVar22 & 0xfffffffffffffff0);
          bVar13 = InstanceArrayIntersector1MB::occluded(&pre,ray,context,prim);
          if (!bVar13) {
            uVar17 = 0;
            do {
              prim = prim + 1;
              if (uVar14 - 9 == uVar17) goto LAB_00233df6;
              bVar25 = InstanceArrayIntersector1MB::occluded(&pre,ray,context,prim);
              uVar17 = uVar17 + 1;
            } while (!bVar25);
            bVar25 = uVar17 < uVar14 - 8;
          }
          iVar23 = 0;
          if (bVar25) {
            ray->tfar = -INFINITY;
            iVar23 = 3;
          }
        }
      }
LAB_00233df6:
    } while (iVar23 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }